

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O3

typed_statement_t * __thiscall tchecker::ta::system_t::statement(system_t *this,edge_id_t id)

{
  bool bVar1;
  
  bVar1 = tchecker::system::edges_t::is_edge
                    (&(this->super_system_t).super_system_t.super_edges_t,id);
  if (bVar1) {
    return (this->_statements).
           super__Vector_base<tchecker::ta::system_t::compiled_statement_t,_std::allocator<tchecker::ta::system_t::compiled_statement_t>_>
           ._M_impl.super__Vector_impl_data._M_start[id]._typed_stmt.
           super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  __assert_fail("is_edge(id)",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/ta/system.cc"
                ,0x57,
                "const tchecker::typed_statement_t &tchecker::ta::system_t::statement(tchecker::edge_id_t) const"
               );
}

Assistant:

tchecker::typed_statement_t const & system_t::statement(tchecker::edge_id_t id) const
{
  assert(is_edge(id));
  return *_statements[id]._typed_stmt;
}